

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.c
# Opt level: O0

ssize_t add_from_client(void *reader_ctx,uchar *buf,size_t buflen,CURLcode *err)

{
  CURLcode CVar1;
  _Bool local_41;
  void *pvStack_40;
  _Bool eos;
  size_t nread;
  Curl_easy *data;
  CURLcode *err_local;
  size_t buflen_local;
  uchar *buf_local;
  void *reader_ctx_local;
  
  nread = (size_t)reader_ctx;
  data = (Curl_easy *)err;
  err_local = (CURLcode *)buflen;
  buflen_local = (size_t)buf;
  buf_local = (uchar *)reader_ctx;
  CVar1 = Curl_client_read((Curl_easy *)reader_ctx,(char *)buf,buflen,
                           (size_t *)&stack0xffffffffffffffc0,&local_41);
  data->magic = CVar1;
  if (data->magic == 0) {
    if ((local_41 & 1U) != 0) {
      *(uint *)(nread + 0x189) = *(uint *)(nread + 0x189) & 0xffffffdf | 0x20;
    }
    reader_ctx_local = pvStack_40;
  }
  else {
    reader_ctx_local = (void *)0xffffffffffffffff;
  }
  return (ssize_t)reader_ctx_local;
}

Assistant:

static ssize_t add_from_client(void *reader_ctx,
                               unsigned char *buf, size_t buflen,
                               CURLcode *err)
{
  struct Curl_easy *data = reader_ctx;
  size_t nread;
  bool eos;

  *err = Curl_client_read(data, (char *)buf, buflen, &nread, &eos);
  if(*err)
    return -1;
  if(eos)
    data->req.eos_read = TRUE;
  return (ssize_t)nread;
}